

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

int main(void)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Calculator calc;
  double local_b8;
  double local_b0;
  String local_a0;
  undefined1 local_88 [16];
  Array<Calculator::Token> local_78;
  Array<double> local_70;
  Array<asl::Map<asl::String,_double>::KeyVal> local_68;
  Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal> local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Array<asl::Map<asl::String,_double>::KeyVal> local_38;
  
  iVar2 = 0;
  local_b8 = 0.0;
  dVar3 = asl::now();
  do {
    asl::String::String((String *)local_88,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
    asl::String::String(&local_a0,"i");
    local_40 = (double)iVar2;
    asl::Dic<double>::Dic((Dic<double> *)&local_38,&local_a0,&local_40);
    dVar4 = Calculator::eval((String *)local_88,(Dic<double> *)&local_38);
    asl::Array<asl::Map<asl::String,_double>::KeyVal>::~Array(&local_38);
    if (local_a0._size != 0) {
      free(local_a0.field_2._str);
    }
    if (local_88._0_4_ != 0) {
      free((void *)local_88._8_8_);
    }
    local_b8 = local_b8 + dVar4;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 10000);
  dVar4 = asl::now();
  local_48 = (dVar4 - dVar3) / 10000.0;
  printf("Eval:    %f (%.3f us)\n",local_b8,local_48 * 1000000.0);
  asl::String::String(&local_a0,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
  Calculator::Calculator((Calculator *)local_88,&local_a0);
  if (local_a0._size != 0) {
    free(local_a0.field_2._str);
  }
  dVar3 = asl::now();
  local_b8 = 0.0;
  iVar2 = 0;
  do {
    asl::String::String(&local_a0,"i");
    pdVar1 = asl::Map<asl::String,_double>::operator[]
                       ((Map<asl::String,_double> *)&local_68,&local_a0);
    *pdVar1 = (double)iVar2;
    dVar4 = Calculator::compute((Calculator *)local_88);
    if (local_a0._size != 0) {
      free(local_a0.field_2._str);
    }
    local_b8 = local_b8 + dVar4;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 10000);
  dVar4 = asl::now();
  local_50 = (dVar4 - dVar3) / 10000.0;
  printf("Compute: %f (%.3f us)\n",local_b8);
  asl::Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal>::~Array(&local_60);
  asl::Array<asl::Map<asl::String,_double>::KeyVal>::~Array(&local_68);
  LOCK();
  pdVar1 = local_70._a + -1;
  *(int *)pdVar1 = *(int *)pdVar1 + -1;
  UNLOCK();
  if (*(int *)pdVar1 == 0) {
    free(local_70._a + -2);
    local_70._a = (double *)0x0;
  }
  asl::Array<Calculator::Token>::~Array(&local_78);
  asl::Array<Calculator::Token>::~Array((Array<Calculator::Token> *)(local_88 + 8));
  asl::Array<Calculator::Token>::~Array((Array<Calculator::Token> *)local_88);
  iVar2 = 0;
  local_58 = asl::now();
  dVar3 = 0.0;
  local_b0 = 0.0;
  do {
    dVar4 = cos((double)iVar2);
    dVar5 = dVar3 * 9.869604401089358;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_b0 = local_b0 + dVar4 * -3.5 + ((dVar5 + -2.0) * 3.141592653589793) / 3.0;
    dVar3 = dVar3 + 1.0;
    iVar2 = iVar2 + 5;
  } while (iVar2 != 50000);
  dVar3 = asl::now();
  dVar3 = (dVar3 - local_58) / 10000.0;
  printf("Native:  %f (%.3f us)\n",local_b0,dVar3 * 1000000.0);
  printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n",local_50 / dVar3,
         local_48 / dVar3);
  return 0;
}

Assistant:

int main()
{
	const int n = 10000; // do computation n times

	double t_eval, t_compute, t_native;

	// using eval():
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += Calculator::eval("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3", Dic<double>("i", i));
		}
		double t2 = now();
		t_eval = (t2 - t1) / n;
		printf("Eval:    %f (%.3f us)\n", y, t_eval * 1e6);
	}

	// parsing once and then using compute():
	{
		Calculator calc("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += calc.set("i", i).compute();
		}
		double t2 = now();
		t_compute = (t2 - t1) / n;
		printf("Compute: %f (%.3f us)\n", y, t_compute * 1e6);
	}

	// now the same in native code:
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++)
			y += -3.5*cos(i*5.0) + PI*(-2 + sqrt(i*pow(PI, 2))) / 3;
		double t2 = now();
		t_native = (t2 - t1) / n;
		printf("Native:  %f (%.3f us)\n", y, t_native * 1e6);
	}

	printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n", t_compute/t_native, t_eval/t_native);
}